

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O3

Variant * Jinx::Impl::AsyncCallWith
                    (Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  Script *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  pointer pVVar1;
  _Rb_tree_node_base *p_Var2;
  RuntimeID functionID;
  char *message;
  CollectionPtr collPtr;
  Parameters fnParams;
  undefined1 local_78 [32];
  vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> local_58;
  Script *local_38;
  
  this = (Script *)(script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00._M_pi =
       (script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
    }
  }
  pVVar1 = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 == (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl
                .super__Vector_impl_data._M_finish) {
    message = "\'async call with\' function invoked with no parameters";
  }
  else {
    if (pVVar1->m_type == Function) {
      local_58.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pVVar1[1].m_type == Collection) {
        local_38 = this;
        Variant::GetCollection((Variant *)local_78);
        p_Var2 = (_Rb_tree_node_base *)((element_type *)(local_78._0_8_ + 0x18))->_vptr_ICoroutine;
        if (p_Var2 != (_Rb_tree_node_base *)(local_78._0_8_ + 8)) {
          do {
            std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back
                      (&local_58,(value_type *)&p_Var2[2]._M_parent);
            p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
          } while (p_Var2 != (_Rb_tree_node_base *)(local_78._0_8_ + 8));
        }
        local_78._16_8_ = local_38;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
          local_78._16_8_ = local_38;
        }
      }
      else {
        std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back(&local_58,pVVar1 + 1)
        ;
        local_78._16_8_ = this;
      }
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
        }
      }
      local_78._24_8_ = this_00._M_pi;
      functionID = Variant::GetFunction
                             ((params->
                              super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>).
                              _M_impl.super__Vector_impl_data._M_start);
      CreateCoroutine((Jinx *)local_78,(shared_ptr<Jinx::IScript> *)(local_78 + 0x10),functionID,
                      &local_58);
      __return_storage_ptr__->m_type = Null;
      Variant::SetCoroutine(__return_storage_ptr__,(CoroutinePtr *)local_78);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_);
      }
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::~vector(&local_58);
      goto LAB_001263c5;
    }
    message = "Invalid parameters to \'async call with\' function";
  }
  Script::Error(this,message);
  __return_storage_ptr__->m_type = Null;
  Variant::SetNull(__return_storage_ptr__);
LAB_001263c5:
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant AsyncCallWith(ScriptPtr script, const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		if (params.empty())
		{
			s->Error("'async call with' function invoked with no parameters");
			return nullptr;
		}
		if (!params[0].IsFunction())
		{
			s->Error("Invalid parameters to 'async call with' function");
			return nullptr;
		}
		Parameters fnParams;
		if (params[1].IsCollection())
		{
			auto collPtr = params[1].GetCollection();
			auto & coll = *collPtr;
			for (const auto & pair : coll)
				fnParams.push_back(pair.second);
		}
		else
		{
			fnParams.push_back(params[1]);
		}
		return CreateCoroutine(s, params[0].GetFunction(), fnParams);
	}